

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ReComputeH
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node)

{
  uint uVar1;
  ulong uVar2;
  type pBVar3;
  size_t sVar4;
  size_type sVar5;
  reference pvVar6;
  type pBVar7;
  double *pdVar8;
  ostream *poVar9;
  undefined8 uVar10;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_RSI;
  long in_RDI;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double c;
  Index ja;
  Index val_jaI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid_JAs;
  double bestValue;
  Index jt_bgI;
  Index jt_oI;
  double h;
  size_t nrJT;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff18;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff48;
  Index in_stack_ffffffffffffff50;
  Index in_stack_ffffffffffffff54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  value_type local_7c;
  uint local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  double local_40;
  char local_38 [16];
  Index IVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *valid_JAs_00;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *this_00;
  
  this_00 = in_RSI;
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x128));
  uVar2 = BayesianGameBase::GetNrJointTypes();
  valid_JAs_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  pBVar3 = boost::shared_ptr<BGIP_BnB_Node>::operator->((shared_ptr<BGIP_BnB_Node> *)in_RSI);
  sVar4 = BGIP_BnB_Node::GetDepth(pBVar3);
  for (uVar1 = (uint)sVar4; uVar1 < uVar2; uVar1 = uVar1 + 1) {
    in_stack_ffffffffffffff48 = local_38;
    boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
              ((shared_ptr<BGIP_BnB_Node> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff50 =
         GetJTIndexMapping(in_stack_ffffffffffffff20,
                           (Index)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                           (BGIP_BnB_NodePtr *)0x132af5);
    boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x132b03);
    local_40 = -1.79769313486232e+308;
    in_stack_ffffffffffffff54 = in_stack_ffffffffffffff50;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x132b32);
    IVar16 = in_stack_ffffffffffffff54;
    boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
              ((shared_ptr<BGIP_BnB_Node> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    ComputeValidJointActions
              (this_00,(Index)(uVar2 >> 0x20),valid_JAs_00,
               (BGIP_BnB_NodePtr *)CONCAT44(uVar1,IVar16));
    boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x132b7b);
    local_78 = 0;
    while( true ) {
      uVar11 = (ulong)local_78;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_58);
      if (sVar5 <= uVar11) break;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_58,(ulong)local_78);
      local_7c = *pvVar6;
      pBVar7 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
                         ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x128)
                         );
      in_stack_ffffffffffffff30 =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           (**(code **)(*(long *)pBVar7 + 0x80))(pBVar7,IVar16,local_7c);
      local_88 = in_stack_ffffffffffffff30;
      pdVar8 = std::max<double>((double *)&local_88,&local_40);
      local_40 = *pdVar8;
      local_78 = local_78 + 1;
    }
    pBVar7 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
                       ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x128));
    uVar11 = (**(code **)(*(long *)pBVar7 + 0x68))(pBVar7,IVar16);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar11;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_40;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = valid_JAs_00;
    auVar13 = vfmadd213sd_fma(auVar13,auVar14,auVar15);
    valid_JAs_00 = auVar13._0_8_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff30);
  }
  if (2 < *(int *)(in_RDI + 0x110)) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\tBGIP_SolverBranchAndBoundUpdated H from ");
    pBVar3 = boost::shared_ptr<BGIP_BnB_Node>::operator->((shared_ptr<BGIP_BnB_Node> *)in_RSI);
    dVar12 = BGIP_BnB_Node::GetH(pBVar3);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar12);
    poVar9 = std::operator<<(poVar9," to ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(double)valid_JAs_00);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  boost::shared_ptr<BGIP_BnB_Node>::operator->((shared_ptr<BGIP_BnB_Node> *)in_RSI);
  BGIP_BnB_Node::SetH((double)valid_JAs_00);
  if ((*(byte *)(in_RDI + 0x1a6) & 1) != 0) {
    uVar10 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         in_stack_ffffffffffffff48);
    __cxa_throw(uVar10,&E::typeinfo,E::~E);
  }
  return;
}

Assistant:

void ReComputeH(BGIP_BnB_NodePtr node)
{
    size_t nrJT = _m_bgip->GetNrJointTypes();
    //size_t _m_nrAgents = _m_bgip->GetNrAgents();
    double h=0;
    for(Index jt_oI = node->GetDepth(); jt_oI < nrJT; ++jt_oI)
    {
        Index jt_bgI = GetJTIndexMapping(jt_oI, node);    
        double bestValue=-DBL_MAX;
        std::vector< Index > valid_JAs;
        //the next call assumes that the induced policy for *node*
        //has been set!
        ComputeValidJointActions(jt_bgI, valid_JAs, node);
        for(Index val_jaI=0; val_jaI < valid_JAs.size(); val_jaI++)
        {
            Index ja = valid_JAs[val_jaI];
            double c=_m_bgip->GetUtility(jt_bgI,ja);
            bestValue=std::max(c,bestValue);
        }
        h+=_m_bgip->GetProbability(jt_bgI)*bestValue;
    }
    if(_m_verbosity>2)
        std::cout << "\tBGIP_SolverBranchAndBoundUpdated H from " << node->GetH()
                  << " to " << h << std::endl;
    node->SetH(h);

    if(_m_reComputeJTIndexMapping)
    {
    switch(_m_jtOrdering)
    {
#if DYNAMIC_JT_INDEX_MAPPING
    case BGIP_BnB::ConsistentMaxContribution:
    {
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled ConsistentMaxContribution nyi"));
//         std::vector<double> CIvalues=_m_completeInformationValues;
//         const std::vector<double> & origCIvalues=_m_completeInformationValues;
//         SortDescending(CIvalues);

//         ReOrderJointTypes(origCIvalues,CIvalues,jtIndexMapping);
        break;
    }
    // reorder to have joint types with the worst
    // heuristic complete information values first
    case BGIP_BnB::ConsistentMinContribution:
    {
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled ConsistentMinContribution nyi"));
//         std::vector<double> minValues=ComputeMinContributionValues();
//         std::vector<double> origMinValues=minValues;
//         // sorts in ascending order, no need to invert now
//         SortAscending(minValues);

//         if(_m_verbosity>2)
//             std::cout << "Sorted Minimum contribution values: "
//                       << SoftPrintVector(minValues)
//                       << std::endl;
//         ReOrderJointTypes(origMinValues,minValues,jtIndexMapping);
        break;
    }
    case BGIP_BnB::ConsistentMaxContributionDifference:
    {
//         std::vector<vector < Index > > impliedJpol=InitImpliedJPol();
//         node->GetImpliedJPol(impliedJpol);
        size_t nrJTtoReOrder=_m_bgip->GetNrJointTypes() - node->GetDepth();
        std::vector<double> origDiffValues(nrJTtoReOrder);
        std::vector<Index> jtIndexMappingPartial(nrJTtoReOrder);
        std::vector<bool> jaAlreadySpecified(_m_bgip->GetNrJointActions(), false);

        std::vector< std::vector< Index > > impliedJPol(_m_nrAgents);
        for(Index agI=0; agI < _m_nrAgents; agI++)
        {
            impliedJPol[agI] = std::vector< Index >(
                _m_bgip->GetNrTypes(agI), UNSPECIFIED_ACTION );
        }
        node->GetImpliedJPol(impliedJPol);

        for(Index i=0;i!=origDiffValues.size();++i)
        {
            Index jt_oI=node->GetDepth() + i;
            Index jtI=node->GetJTIndexMapping(jt_oI);
            jtIndexMappingPartial.at(i)=jtI;
            double minValue=DBL_MAX;
            double maxValue=-DBL_MAX;
            const std::vector<Index> &indTypes=
                _m_bgip->JointToIndividualTypeIndices(jtI);
            
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                const std::vector<Index> &indActions=
                    _m_bgip->JointToIndividualActionIndices(ja);

                bool jaAlreadySpecified=true;
                for(Index agI=0;agI!=_m_nrAgents;++agI)
                {
                    if(impliedJPol[agI][indTypes[agI]]!=indActions[agI])
                        jaAlreadySpecified=false;
                }
                if(!jaAlreadySpecified)
                {
                    double c=GetContribution(jtI,ja);
                    minValue=std::min(c,minValue);
                    maxValue=std::max(c,maxValue);
                }
            }
            origDiffValues[i]=maxValue-minValue;
        }

        std::vector<double> diffValues=origDiffValues;

        SortDescending(diffValues);
        
        if(_m_verbosity>2)
        {
            std::cout << "BGIP_SolverBranchAndBound Original Max difference contribution values: "
                      << SoftPrintVector(origDiffValues)
                      << std::endl;
            std::cout << "BGIP_SolverBranchAndBound Sorted Max difference contribution values: "
                      << SoftPrintVector(diffValues)
                      << std::endl;
        }
        std::vector<Index> jtIndexMapping;
        ReOrderJointTypes(jtIndexMappingPartial,
                          origDiffValues,
                          diffValues,
                          jtIndexMapping);
        for(Index i=0;i!=jtIndexMapping.size();++i)
        {
            Index jt_oI=node->GetDepth() + i;
            node->SetJTIndexMapping(jt_oI, jtIndexMapping[i]);
        }
        break;
    }
#endif
    default:
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled BnB_JointTypeOrdering"));
    }

    }
}